

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O3

void __thiscall XPMP2::CSLModel::Unload(CSLModel *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->listObj).super__List_base<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->listObj; p_Var1 = p_Var1->_M_next) {
    CSLObj::Unload((CSLObj *)(p_Var1 + 1));
  }
  return;
}

Assistant:

void CSLModel::Unload ()
{
    for (CSLObj& o: listObj)
        o.Unload();
}